

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

pool_ptr<soul::AST::Namespace> __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::findParameterisedNamespace
          (QualifiedIdentifierResolver *this,QualifiedIdentifier *qi,int *itemsRemoved)

{
  _func_int **pp_Var1;
  int *in_RCX;
  _func_int **pp_Var2;
  string p;
  IdentifierPath path;
  NameSearch local_1c0;
  string local_100;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_e0;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_88;
  
  *in_RCX = 1;
  IdentifierPath::operator+
            ((IdentifierPath *)&local_1c0,(IdentifierPath *)(itemsRemoved + 0x12),
             *(IdentifierPath **)(itemsRemoved + 0xc));
  IdentifierPath::getParentPath((IdentifierPath *)&local_e0,(IdentifierPath *)&local_1c0);
  local_1c0.itemsFound.numActive = 0;
  if ((8 < local_1c0.itemsFound.numAllocated) &&
     (local_1c0.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
    operator_delete__(local_1c0.itemsFound.items);
  }
  IdentifierPath::toString_abi_cxx11_(&local_100,(IdentifierPath *)&local_e0);
  if (local_e0.numActive != 0) {
    do {
      local_1c0.itemsFound.numActive = 0;
      local_1c0.itemsFound.numAllocated = 8;
      local_1c0.partiallyQualifiedPath.pathSections.items =
           (Identifier *)local_1c0.partiallyQualifiedPath.pathSections.space;
      local_1c0.partiallyQualifiedPath.pathSections.numActive = 0;
      local_1c0.partiallyQualifiedPath.pathSections.numAllocated = 8;
      local_1c0.stopAtFirstScopeWithResults = false;
      local_1c0.requiredNumFunctionArgs = -1;
      local_1c0.findVariables = true;
      local_1c0.findTypes = true;
      local_1c0.findFunctions = true;
      local_1c0.findNamespaces = true;
      local_1c0.findProcessors = true;
      local_1c0.findProcessorInstances = false;
      local_1c0.findEndpoints = true;
      local_1c0.onlyFindLocalVariables = false;
      local_1c0.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_1c0.itemsFound.space;
      ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
                (&local_1c0.partiallyQualifiedPath.pathSections,&local_e0);
      local_1c0.stopAtFirstScopeWithResults = true;
      local_1c0.findVariables = false;
      local_1c0.findTypes = false;
      local_1c0.findFunctions = false;
      local_1c0.findNamespaces = true;
      local_1c0.findProcessors = false;
      local_1c0.findProcessorInstances = false;
      local_1c0.findEndpoints = false;
      if (*(Scope **)(itemsRemoved + 8) != (Scope *)0x0) {
        AST::Scope::performFullNameSearch
                  (*(Scope **)(itemsRemoved + 8),&local_1c0,
                   (Statement *)
                   (qi->pathSections).
                   super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if ((local_1c0.itemsFound.numActive != 0) && (*(uint64_t *)local_1c0.itemsFound.items != 0)) {
        pp_Var1 = (_func_int **)
                  __dynamic_cast(*(uint64_t *)local_1c0.itemsFound.items,&AST::ASTObject::typeinfo,
                                 &AST::Namespace::typeinfo,0);
        if (pp_Var1 != (_func_int **)0x0) {
          pp_Var2 = (_func_int **)0x0;
          if (pp_Var1[10] != pp_Var1[0xb]) {
            pp_Var2 = pp_Var1;
          }
          (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
          super_RewritingASTVisitor._vptr_RewritingASTVisitor = pp_Var2;
          local_1c0.partiallyQualifiedPath.pathSections.numActive = 0;
          if (8 < local_1c0.partiallyQualifiedPath.pathSections.numAllocated) {
            if (local_1c0.partiallyQualifiedPath.pathSections.items != (Identifier *)0x0) {
              operator_delete__(local_1c0.partiallyQualifiedPath.pathSections.items);
            }
            local_1c0.partiallyQualifiedPath.pathSections.items =
                 (Identifier *)local_1c0.partiallyQualifiedPath.pathSections.space;
            local_1c0.partiallyQualifiedPath.pathSections.numAllocated = 8;
          }
          local_1c0.itemsFound.numActive = 0;
          if ((8 < local_1c0.itemsFound.numAllocated) &&
             (local_1c0.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
            operator_delete__(local_1c0.itemsFound.items);
          }
          goto LAB_001ed999;
        }
      }
      IdentifierPath::getParentPath((IdentifierPath *)&local_88,(IdentifierPath *)&local_e0);
      ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_e0,&local_88);
      local_88.numActive = 0;
      if ((8 < local_88.numAllocated) && (local_88.items != (Identifier *)0x0)) {
        operator_delete__(local_88.items);
      }
      *in_RCX = *in_RCX + 1;
      local_1c0.partiallyQualifiedPath.pathSections.numActive = 0;
      if (8 < local_1c0.partiallyQualifiedPath.pathSections.numAllocated) {
        if (local_1c0.partiallyQualifiedPath.pathSections.items != (Identifier *)0x0) {
          operator_delete__(local_1c0.partiallyQualifiedPath.pathSections.items);
        }
        local_1c0.partiallyQualifiedPath.pathSections.items =
             (Identifier *)local_1c0.partiallyQualifiedPath.pathSections.space;
        local_1c0.partiallyQualifiedPath.pathSections.numAllocated = 8;
      }
      local_1c0.itemsFound.numActive = 0;
      if ((8 < local_1c0.itemsFound.numAllocated) &&
         (local_1c0.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
        operator_delete__(local_1c0.itemsFound.items);
      }
    } while (local_e0.numActive != 0);
  }
  (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
  super_RewritingASTVisitor._vptr_RewritingASTVisitor = (_func_int **)0x0;
LAB_001ed999:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_e0.numActive = 0;
  if ((8 < local_e0.numAllocated) && (local_e0.items != (Identifier *)0x0)) {
    operator_delete__(local_e0.items);
  }
  return (pool_ptr<soul::AST::Namespace>)(Namespace *)this;
}

Assistant:

pool_ptr<AST::Namespace> findParameterisedNamespace (AST::QualifiedIdentifier& qi, int& itemsRemoved)
        {
            itemsRemoved = 1;
            auto path = qi.getPath().getParentPath();
            auto p = path.toString();

            while (! path.empty())
            {
                AST::Scope::NameSearch search;
                search.partiallyQualifiedPath = path;
                search.stopAtFirstScopeWithResults = true;
                search.findVariables = false;
                search.findTypes = false;
                search.findFunctions = false;
                search.findNamespaces = true;
                search.findProcessors = false;
                search.findProcessorInstances = false;
                search.findEndpoints = false;

                if (auto scope = qi.getParentScope())
                    scope->performFullNameSearch (search, currentStatement.get());

                if (search.itemsFound.size() != 0)
                {
                    auto item = search.itemsFound.front();

                    if (auto n = cast<AST::Namespace> (item))
                    {
                        if (n->isTemplateModule())
                            return n;

                        return {};
                    }
                }

                path = path.getParentPath();
                itemsRemoved++;
            }

            return {};
        }